

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O3

int Cec3_ManSweepNode(Cec3_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  Gia_Rpr_t *pGVar2;
  long *plVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Gia_Man_t *pGVar6;
  word *pwVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  Gia_Obj_t *pGVar18;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar8 = clock_gettime(3,&local_48);
  if (iVar8 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (-1 < iObj) {
    pGVar6 = p->pAig;
    if (iObj < pGVar6->nObjs) {
      uVar14 = (ulong)(uint)pGVar6->pReprs[(uint)iObj] & 0xfffffff;
      if (uVar14 == 0xfffffff) {
        pGVar18 = (Gia_Obj_t *)0x0;
      }
      else {
        if ((uint)pGVar6->nObjs <= (uint)uVar14) goto LAB_0065d31d;
        pGVar18 = pGVar6->pObjs + uVar14;
      }
      pGVar1 = pGVar6->pObjs + (uint)iObj;
      uVar10 = pGVar1->Value;
      if (-1 < (int)uVar10) {
        uVar16 = pGVar18->Value;
        local_38 = lVar13;
        if (-1 < (int)uVar16) {
          uVar15 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x3f) ^ (uVar16 ^ uVar10) & 1;
          uVar12 = -(int)((long)*(undefined8 *)pGVar18 >> 0x3f);
          iVar8 = Cec3_ManSolveTwo(p,uVar16 >> 1,uVar10 >> 1,uVar15 ^ uVar12);
          if (iVar8 == -1) {
            p->nSatUnsat = p->nSatUnsat + 1;
            if ((int)pGVar18->Value < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            pGVar1->Value = pGVar18->Value ^ (uint)(uVar15 != uVar12);
            pGVar2 = p->pAig->pReprs + (uint)iObj;
            *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0x10000000);
            iVar8 = clock_gettime(3,&local_48);
            if (iVar8 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar8 = 1;
            lVar17 = 0x70;
          }
          else if (iVar8 == 1) {
            uVar4 = p->nPatterns;
            uVar5 = p->nSatSat;
            p->nPatterns = uVar4 + 1;
            p->nSatSat = uVar5 + 1;
            pGVar6 = p->pAig;
            iVar9 = pGVar6->nSimWords * 0x40;
            iVar8 = 1;
            if (pGVar6->iPatsPi != iVar9 + -1) {
              iVar8 = pGVar6->iPatsPi + 1;
            }
            pGVar6->iPatsPi = iVar8;
            if ((iVar8 < 1) || (iVar9 <= iVar8)) {
              __assert_fail("p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                            ,0x36a,"int Cec3_ManSweepNode(Cec3_Man_t *, int)");
            }
            pVVar11 = p->vObjSatPairs;
            if (1 < pVVar11->nSize) {
              lVar13 = 1;
              do {
                iVar8 = pVVar11->pArray[lVar13 + -1];
                pGVar6 = p->pAig;
                uVar10 = bmcg_sat_solver_read_cex_varvalue(p->pSat,pVVar11->pArray[lVar13]);
                uVar16 = iVar8 * pGVar6->nSimWords;
                if (((int)uVar16 < 0) || (pGVar6->vSims->nSize <= (int)uVar16)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                pwVar7 = pGVar6->vSims->pArray;
                lVar17 = (long)(pGVar6->iPatsPi >> 5);
                uVar15 = *(uint *)((long)pwVar7 + lVar17 * 4 + (ulong)uVar16 * 8);
                uVar12 = pGVar6->iPatsPi & 0x1f;
                if (((uVar15 >> uVar12 & 1) != 0) != uVar10) {
                  *(uint *)((long)pwVar7 + lVar17 * 4 + (ulong)uVar16 * 8) = uVar15 ^ 1 << uVar12;
                }
                pVVar11 = p->vObjSatPairs;
                lVar13 = lVar13 + 2;
              } while ((int)lVar13 < pVVar11->nSize);
            }
            iVar8 = clock_gettime(3,&local_48);
            if (iVar8 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar8 = 0;
            lVar17 = 0x68;
          }
          else {
            p->nSatUndec = p->nSatUndec + 1;
            if (iVar8 != 0) {
              __assert_fail("status == GLUCOSE_UNDEC",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                            ,0x37c,"int Cec3_ManSweepNode(Cec3_Man_t *, int)");
            }
            pGVar2 = p->pAig->pReprs + (uint)iObj;
            *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0x20000000);
            iVar8 = clock_gettime(3,&local_48);
            if (iVar8 < 0) {
              lVar13 = -1;
            }
            else {
              lVar13 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar8 = 2;
            lVar17 = 0x78;
          }
          plVar3 = (long *)((long)&p->pPars + lVar17);
          *plVar3 = *plVar3 + lVar13 + local_38;
          if (p->pPars->fUseCones == 0) {
            iVar9 = clock_gettime(3,&local_48);
            if (iVar9 < 0) {
              lVar13 = 1;
            }
            else {
              lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
              lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_48.tv_sec * -1000000;
            }
            bmcg_sat_solver_reset(p->pSat);
            iVar9 = clock_gettime(3,&local_48);
            if (iVar9 < 0) {
              lVar17 = -1;
            }
            else {
              lVar17 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            p->timeExtra = p->timeExtra + lVar17 + lVar13;
          }
          return iVar8;
        }
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
  }
LAB_0065d31d:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Cec3_ManSweepNode( Cec3_Man_t * p, int iObj )
{
    abctime clk = Abc_Clock();
    int i, IdAig, IdSat, status, RetValue = 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pAig, iObj );
    Gia_Obj_t * pRepr = Gia_ObjReprObj( p->pAig, iObj );
    int fCompl = Abc_LitIsCompl(pObj->Value) ^ Abc_LitIsCompl(pRepr->Value) ^ pObj->fPhase ^ pRepr->fPhase;
    status = Cec3_ManSolveTwo( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
    if ( status == GLUCOSE_SAT )
    {
        p->nSatSat++;
        p->nPatterns++;
        p->pAig->iPatsPi = (p->pAig->iPatsPi == 64 * p->pAig->nSimWords - 1) ? 1 : p->pAig->iPatsPi + 1;
        assert( p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords );
        Vec_IntForEachEntryDouble( p->vObjSatPairs, IdAig, IdSat, i )
//            Cec3_ObjSimSetInputBit( p->pAig, IdAig, satoko_var_polarity(p->pSat, IdSat) == SATOKO_LIT_TRUE );
            Cec3_ObjSimSetInputBit( p->pAig, IdAig, bmcg_sat_solver_read_cex_varvalue(p->pSat, IdSat) );
        p->timeSatSat += Abc_Clock() - clk;
        RetValue = 0;
    }
    else if ( status == GLUCOSE_UNSAT )
    {
        p->nSatUnsat++;
        pObj->Value = Abc_LitNotCond( pRepr->Value, fCompl );
        Gia_ObjSetProved( p->pAig, iObj );
        p->timeSatUnsat += Abc_Clock() - clk;
        RetValue = 1;
    }
    else 
    {
        p->nSatUndec++;
        assert( status == GLUCOSE_UNDEC );
        Gia_ObjSetFailed( p->pAig, iObj );
        p->timeSatUndec += Abc_Clock() - clk;
        RetValue = 2;
    }
    if ( p->pPars->fUseCones )
        return RetValue;
    clk = Abc_Clock();
    bmcg_sat_solver_reset( p->pSat );
    p->timeExtra += Abc_Clock() - clk;
//    satoko_stats(p->pSat)->n_conflicts = 0;
    return RetValue;
}